

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O1

void __thiscall
Js::JavascriptPromise::ExtractSnapObjectDataInto
          (JavascriptPromise *this,SnapObject *objData,SlabAllocator *alloc)

{
  uint uVar1;
  Var v;
  _func_int *p_Var2;
  SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *pSVar3;
  code *pcVar4;
  undefined1 auVar5 [8];
  NodeBase *pNVar6;
  bool bVar7;
  SnapPromiseReactionInfo *pSVar8;
  Type *pTVar9;
  unsigned_long *dependsOnArray;
  Type *pTVar10;
  ulong uVar11;
  uint32 i;
  ulong uVar12;
  undefined1 local_90 [8];
  List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> depOnList
  ;
  undefined1 local_50 [8];
  Iterator it;
  Type local_38;
  
  depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)0x0;
  depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.buffer._0_4_ =
       0;
  depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>._16_8_ =
       &Memory::HeapAllocator::Instance;
  local_90 = (undefined1  [8])&PTR_IsReadOnly_015454f0;
  depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  it.current = (NodeBase *)TTD::SlabAllocatorBase<0>::SlabAllocateTypeRawSize<48ul>(alloc);
  it.current[1].next.ptr = (SListNodeBase<Memory::Recycler> *)(this->result).ptr;
  v = (this->result).ptr;
  if ((v != (Var)0x0) && (bVar7 = TTD::JsSupport::IsVarComplexKind(v), bVar7)) {
    p_Var2 = (_func_int *)(this->result).ptr;
    JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *)local_90,0);
    depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
    _vptr_ReadOnlyList
    [(int)(uint)depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
                buffer] = p_Var2;
    depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.buffer._0_4_
         = (uint)depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>
                 .buffer + 1;
  }
  *(uint *)&((it.current)->next).ptr = (uint)this->status;
  *(Type *)((long)&((it.current)->next).ptr + 4) = this->isHandled;
  *(undefined4 *)&it.current[2].next.ptr = 0;
  pSVar3 = (this->reactions).ptr;
  if (pSVar3 != (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0) {
    local_50 = (undefined1  [8])pSVar3;
    it.list = &pSVar3->
               super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>;
    depOnList._40_8_ = __tls_get_addr(&PTR_0155fe48);
    while( true ) {
      if (it.list ==
          (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *(undefined4 *)depOnList._40_8_ = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar7) goto LAB_00d01701;
        *(undefined4 *)depOnList._40_8_ = 0;
      }
      auVar5 = local_50;
      pSVar3 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
               ((it.list)->super_SListNodeBase<Memory::Recycler>).next.ptr;
      Memory::Recycler::WBSetBit((char *)&local_38);
      local_38.ptr = (SListNodeBase<Memory::Recycler> *)pSVar3;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
      if ((undefined1  [8])local_38.ptr == auVar5) break;
      pSVar3 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
               ((it.list)->super_SListNodeBase<Memory::Recycler>).next.ptr;
      Memory::Recycler::WBSetBit((char *)&local_38);
      local_38.ptr = (SListNodeBase<Memory::Recycler> *)pSVar3;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
      it.list = (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                local_38.ptr;
      SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Iterator::Data
                ((Iterator *)local_50);
      *(int *)&it.current[2].next.ptr = *(int *)&it.current[2].next.ptr + 1;
    }
    it.list = (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0;
  }
  uVar1 = *(uint *)&it.current[2].next.ptr;
  *(uint *)&it.current[4].next.ptr = uVar1;
  it.current[3].next.ptr = (SListNodeBase<Memory::Recycler> *)0x0;
  it.current[5].next.ptr = (SListNodeBase<Memory::Recycler> *)0x0;
  if ((ulong)uVar1 != 0) {
    pSVar8 = TTD::SlabAllocatorBase<0>::
             SlabAllocateArray<TTD::NSSnapValues::SnapPromiseReactionInfo>(alloc,(ulong)uVar1);
    pNVar6 = it.current;
    it.current[3].next.ptr = (SListNodeBase<Memory::Recycler> *)pSVar8;
    pSVar8 = TTD::SlabAllocatorBase<0>::
             SlabAllocateArray<TTD::NSSnapValues::SnapPromiseReactionInfo>
                       (alloc,(ulong)*(uint *)&it.current[4].next.ptr);
    pNVar6[5].next.ptr = (SListNodeBase<Memory::Recycler> *)pSVar8;
    local_50 = (undefined1  [8])(this->reactions).ptr;
    uVar11 = 0;
    it.list = (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)local_50;
    depOnList._40_8_ = __tls_get_addr(&PTR_0155fe48);
    do {
      if (it.list ==
          (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *(undefined4 *)depOnList._40_8_ = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar7) {
LAB_00d01701:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *(undefined4 *)depOnList._40_8_ = 0;
      }
      auVar5 = local_50;
      pSVar3 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
               ((it.list)->super_SListNodeBase<Memory::Recycler>).next.ptr;
      Memory::Recycler::WBSetBit((char *)&local_38);
      local_38.ptr = (SListNodeBase<Memory::Recycler> *)pSVar3;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
      if ((undefined1  [8])local_38.ptr == auVar5) goto LAB_00d015e0;
      pSVar3 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
               ((it.list)->super_SListNodeBase<Memory::Recycler>).next.ptr;
      Memory::Recycler::WBSetBit((char *)&local_38);
      local_38.ptr = (SListNodeBase<Memory::Recycler> *)pSVar3;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
      it.list = (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                local_38.ptr;
      pTVar9 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Iterator::
               Data((Iterator *)local_50);
      JavascriptPromiseReaction::ExtractSnapPromiseReactionInto
                (pTVar9->resolveReaction,
                 (SnapPromiseReactionInfo *)(it.current[3].next.ptr + uVar11 * 6),
                 (List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)local_90,alloc);
      pTVar9 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Iterator::
               Data((Iterator *)local_50);
      JavascriptPromiseReaction::ExtractSnapPromiseReactionInto
                (pTVar9->rejectReaction,
                 (SnapPromiseReactionInfo *)(it.current[5].next.ptr + uVar11 * 6),
                 (List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)local_90,alloc);
      uVar11 = (ulong)((int)uVar11 + 1);
    } while( true );
  }
LAB_00d01656:
  uVar1 = (uint)depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
                buffer;
  uVar11 = (ulong)(uint)depOnList.
                        super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
                        buffer;
  if (uVar11 == 0) {
    if (objData->SnapObjectTag != SnapPromiseObject) {
      TTDAbort_unrecoverable_error("Tag does not match.");
    }
    objData->AddtlSnapObjectInfo = it.current;
  }
  else {
    dependsOnArray = TTD::SlabAllocatorBase<0>::SlabAllocateArray<unsigned_long>(alloc,uVar11);
    uVar12 = 0;
    do {
      pTVar10 = JsUtil::
                List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)local_90,(int)uVar12);
      dependsOnArray[uVar12] = *pTVar10;
      uVar12 = uVar12 + 1;
    } while (uVar11 != uVar12);
    TTD::NSSnapObjects::
    StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapPromiseInfo*,(TTD::NSSnapObjects::SnapObjectType)28>
              (objData,(SnapPromiseInfo *)it.current,alloc,uVar1,dependsOnArray);
  }
  if (depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
      _vptr_ReadOnlyList != (_func_int **)0x0) {
    local_90 = (undefined1  [8])&PTR_IsReadOnly_015454f0;
    Memory::HeapAllocator::Free
              ((HeapAllocator *)
               depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
               _16_8_,depOnList.
                      super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
                      _vptr_ReadOnlyList,
               (long)(int)depOnList.
                          super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
                          alloc << 3);
  }
  return;
LAB_00d015e0:
  it.list = (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0;
  goto LAB_00d01656;
}

Assistant:

void JavascriptPromise::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        JsUtil::List<TTD_PTR_ID, HeapAllocator> depOnList(&HeapAllocator::Instance);

        TTD::NSSnapObjects::SnapPromiseInfo* spi = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapPromiseInfo>();

        spi->Result = this->result;

        //Primitive kinds always inflated first so we only need to deal with complex kinds as depends on
        if(this->result != nullptr && TTD::JsSupport::IsVarComplexKind(this->result))
        {
            depOnList.Add(TTD_CONVERT_VAR_TO_PTR_ID(this->result));
        }

        spi->Status = this->GetStatus();
        spi->isHandled = this->GetIsHandled();

        // get count of # of reactions
        spi->ResolveReactionCount = 0;
        if (this->reactions != nullptr)
        {
            this->reactions->Map([&spi](JavascriptPromiseReactionPair pair) {
                spi->ResolveReactionCount++;
            });
        }
        spi->RejectReactionCount = spi->ResolveReactionCount;

        // move resolve & reject reactions into slab
        spi->ResolveReactions = nullptr;
        spi->RejectReactions = nullptr;
        if(spi->ResolveReactionCount != 0)
        {
            spi->ResolveReactions = alloc.SlabAllocateArray<TTD::NSSnapValues::SnapPromiseReactionInfo>(spi->ResolveReactionCount);
            spi->RejectReactions = alloc.SlabAllocateArray<TTD::NSSnapValues::SnapPromiseReactionInfo>(spi->RejectReactionCount);

            JavascriptPromiseReactionList::Iterator it = this->reactions->GetIterator();
            uint32 i = 0;
            while (it.Next())
            {
                it.Data().resolveReaction->ExtractSnapPromiseReactionInto(spi->ResolveReactions + i, depOnList, alloc);
                it.Data().rejectReaction->ExtractSnapPromiseReactionInto(spi->RejectReactions + i, depOnList, alloc);
                ++i;
            }
        }

        //see what we need to do wrt dependencies
        if(depOnList.Count() == 0)
        {
            TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapPromiseInfo*, TTD::NSSnapObjects::SnapObjectType::SnapPromiseObject>(objData, spi);
        }
        else
        {
            uint32 depOnCount = depOnList.Count();
            TTD_PTR_ID* depOnArray = alloc.SlabAllocateArray<TTD_PTR_ID>(depOnCount);

            for(uint32 i = 0; i < depOnCount; ++i)
            {
                depOnArray[i] = depOnList.Item(i);
            }

            TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapPromiseInfo*, TTD::NSSnapObjects::SnapObjectType::SnapPromiseObject>(objData, spi, alloc, depOnCount, depOnArray);
        }
    }